

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
CMU462::DynamicScene::Scene::getHoveredObject
          (Scene *this,Vector2D *p,bool getElement,bool transformed)

{
  bool bVar1;
  reference ppSVar2;
  byte in_CL;
  byte in_DL;
  double *in_RSI;
  _Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *in_RDI;
  SceneObject *o_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range2_1;
  int i;
  int ID;
  uchar color [4];
  SceneObject *o;
  iterator __end2;
  iterator __begin2;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range2;
  int pickID;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *in_stack_ffffffffffffff88;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *this_00;
  _Self in_stack_ffffffffffffffa0;
  _Self local_58;
  _Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *local_50;
  int local_44;
  uint local_40;
  undefined1 local_3c [12];
  _Self local_30;
  _Self local_28;
  _Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *local_20;
  undefined4 local_18;
  byte local_12;
  byte local_11;
  double *local_10;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_10 = in_RSI;
  glClearColor(0x3f800000,0x3f800000,0x3f800000);
  glClear(0x4100);
  glPushAttrib(0xfffff);
  glDisable(0xb50);
  glDisable(0xbe2);
  local_18 = 0;
  local_20 = in_RDI + 0x13;
  local_28._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
       ::begin(in_stack_ffffffffffffff88);
  local_30._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
       ::end(in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ppSVar2 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*(in_RDI);
    local_3c._4_8_ = *ppSVar2;
    if ((((SceneObject *)local_3c._4_8_)->isPickable & 1U) != 0) {
      (*((SceneObject *)local_3c._4_8_)->_vptr_SceneObject[9])
                (local_3c._4_8_,&local_18,(ulong)local_12 & 1);
    }
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++(in_RDI);
  }
  this_00 = (set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
             *)local_3c;
  glReadPixels((int)*local_10,(int)local_10[1],1,1,0x1908,0x1401);
  local_40 = RGBToIndex(local_3c[0],local_3c[1],local_3c[2]);
  Selection::clear((Selection *)in_stack_ffffffffffffffa0._M_node);
  local_44 = 0;
  local_50 = in_RDI + 0x13;
  local_58._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
       ::begin(this_00);
  std::
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  ::end(this_00);
  while( true ) {
    bVar1 = std::operator!=(&local_58,(_Self *)&stack0xffffffffffffffa0);
    if (!bVar1) break;
    ppSVar2 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*(in_RDI);
    (*(*ppSVar2)->_vptr_SceneObject[10])(*ppSVar2,(ulong)local_40,in_RDI);
    local_44 = local_44 + 1;
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++(in_RDI);
  }
  if ((local_11 & 1) == 0) {
    in_RDI[1]._M_node = (_Base_ptr)0x0;
  }
  glPopAttrib();
  return;
}

Assistant:

void Scene::getHoveredObject(const Vector2D &p, bool getElement,
                             bool transformed) {
  // Set the background color to the maximum possible value---this value should
  // be far
  // beyond the maximum pick index, since we have at most 2^(8+8+8) = 16,777,216
  // distinct IDs
  glClearColor(1., 1., 1., 1.);

  // Clear any color values currently in the color buffer---we do not want to
  // use these for
  // picking, since they represent, e.g., shading colors rather than pick IDs.
  // Also clear
  // the depth buffer so that we can use it to determine the closest object
  // under the cursor.
  glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

  // We want to draw the pick IDs as raw color values; shading functionality
  // like lighting and blending shouldn't interfere.
  glPushAttrib(GL_ALL_ATTRIB_BITS);
  glDisable(GL_LIGHTING);
  glDisable(GL_BLEND);

  // Keep track of the number of picking IDs used so far
  int pickID = 0;

  for (auto o : objects) {
    if (o->isPickable) {
      // The implementation of draw_pick MUST increment the
      // pickID for each new pickable element it draws.
      o->draw_pick(pickID, transformed);
    }
  }

  unsigned char color[4];
  glReadPixels(p.x, p.y, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, color);

  int ID = RGBToIndex(color[0], color[1], color[2]);

  // By default, set hovered object to "none"
  hovered.clear();

  // Determine which element generated this pick ID
  int i = 0;
  for (auto o : objects) {
    // Call the object's method for setting the selection
    // based on the ID.  (This allows the object to set
    // the selection to an element within that particular
    // object type, e.g., for a mesh it can specify that a
    // particular vertex is selected, or for a camera it might
    // specify that a control handle was selected, etc.)
    o->setSelection(ID, hovered);

    i++;
  }

  if (!getElement) {
    // Discard element information
    hovered.element = NULL;
  }

  // Restore any draw state that we disabled above.
  glPopAttrib();
}